

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
pstore::json::details::number_matcher<pstore::json::null_output>::do_leading_minus_state
          (number_matcher<pstore::json::null_output> *this,parser<pstore::json::null_output> *parser
          ,char c)

{
  error_code local_30;
  byte local_1a;
  char local_19;
  bool match;
  parser<pstore::json::null_output> *ppStack_18;
  char c_local;
  parser<pstore::json::null_output> *parser_local;
  number_matcher<pstore::json::null_output> *this_local;
  
  local_1a = 1;
  local_19 = c;
  ppStack_18 = parser;
  parser_local = (parser<pstore::json::null_output> *)this;
  if (c == '-') {
    matcher<pstore::json::null_output>::set_state(&this->super_matcher<pstore::json::null_output>,3)
    ;
    (this->super_matcher<pstore::json::null_output>).field_0xc = 1;
  }
  else if ((c < '0') || ('9' < c)) {
    std::error_code::error_code<pstore::json::error_code,void>(&local_30,number_out_of_range);
    matcher<pstore::json::null_output>::set_error
              (&this->super_matcher<pstore::json::null_output>,parser,&local_30);
  }
  else {
    matcher<pstore::json::null_output>::set_state(&this->super_matcher<pstore::json::null_output>,3)
    ;
    local_1a = do_integer_initial_digit_state(this,ppStack_18,local_19);
  }
  return (bool)(local_1a & 1);
}

Assistant:

bool number_matcher<Callbacks>::do_leading_minus_state (parser<Callbacks> & parser,
                                                                    char c) {
                bool match = true;
                if (c == '-') {
                    this->set_state (integer_initial_digit_state);
                    is_neg_ = true;
                } else if (c >= '0' && c <= '9') {
                    this->set_state (integer_initial_digit_state);
                    match = do_integer_initial_digit_state (parser, c);
                } else {
                    // minus MUST be followed by the 'int' production.
                    this->set_error (parser, error_code::number_out_of_range);
                }
                return match;
            }